

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,
          vector<int,_std::allocator<int>_> *caseValues,
          vector<int,_std::allocator<int>_> *valueIndexToSegment,int defaultSegment,
          vector<spv::Block_*,_std::allocator<spv::Block_*>_> *segmentBlocks)

{
  iterator *piVar1;
  _Elt_pointer ppBVar2;
  Builder *this_00;
  vector<int,_std::allocator<int>_> *pvVar3;
  vector<int,_std::allocator<int>_> *pvVar4;
  Function *pFVar5;
  Instruction *pIVar6;
  Block *pBVar7;
  _Head_base<0UL,_spv::Instruction_*,_false> *p_Var8;
  pointer piVar9;
  Id IVar10;
  pointer *__ptr;
  size_type __n;
  long lVar11;
  Function *pFVar12;
  Block *mergeBlock;
  _Head_base<0UL,_spv::Instruction_*,_false> local_68;
  Function *local_60;
  Builder *local_58;
  uint local_50;
  Id local_4c;
  vector<int,_std::allocator<int>_> *local_48;
  vector<int,_std::allocator<int>_> *local_40;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  pFVar12 = this->buildPoint->parent;
  pFVar5 = pFVar12;
  local_58 = this;
  local_50 = control;
  local_4c = selector;
  local_48 = caseValues;
  local_40 = valueIndexToSegment;
  if (0 < numSegments) {
    do {
      local_60 = pFVar5;
      pIVar6 = (Instruction *)operator_new(0x90);
      IVar10 = local_58->uniqueId + 1;
      local_58->uniqueId = IVar10;
      pIVar6->_vptr_Instruction = (_func_int **)&PTR__Block_00afabf8;
      pIVar6->resultId = 0;
      pIVar6->typeId = 0;
      *(undefined8 *)&pIVar6->opCode = 0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      pIVar6->block = (Block *)0x0;
      pIVar6[1]._vptr_Instruction = (_func_int **)0x0;
      *(Function **)&pIVar6[1].resultId = pFVar12;
      *(undefined1 *)
       ((long)&pIVar6[1].operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start + 4) = 0;
      *(undefined1 *)
       ((long)&pIVar6[1].operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 4) = 0;
      *(undefined1 *)
       &pIVar6[1].operands.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = 0;
      local_68._M_head_impl = (Instruction *)operator_new(0x60);
      (local_68._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
      (local_68._M_head_impl)->resultId = IVar10;
      (local_68._M_head_impl)->typeId = 0;
      (local_68._M_head_impl)->opCode = OpLabel;
      ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      ((local_68._M_head_impl)->operands).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((local_68._M_head_impl)->operands).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ((local_68._M_head_impl)->operands).
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      (local_68._M_head_impl)->block = (Block *)0x0;
      std::
      vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
      ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
                ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                  *)&pIVar6->resultId,
                 (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
      if (local_68._M_head_impl != (Instruction *)0x0) {
        (*(local_68._M_head_impl)->_vptr_Instruction[1])();
      }
      pFVar12 = local_60;
      *(Instruction **)(*(long *)(*(long *)&pIVar6->opCode + -8) + 0x58) = pIVar6;
      Module::mapInstruction(local_60->parent,*(Instruction **)(*(long *)&pIVar6->opCode + -8));
      local_68._M_head_impl = pIVar6;
      std::vector<spv::Block*,std::allocator<spv::Block*>>::emplace_back<spv::Block*>
                ((vector<spv::Block*,std::allocator<spv::Block*>> *)segmentBlocks,
                 (Block **)&local_68);
      numSegments = numSegments + -1;
      pFVar5 = local_60;
    } while (numSegments != 0);
  }
  pBVar7 = (Block *)operator_new(0x90);
  IVar10 = local_58->uniqueId + 1;
  local_58->uniqueId = IVar10;
  pBVar7->_vptr_Block = (_func_int **)&PTR__Block_00afabf8;
  (pBVar7->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar7->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar7->instructions).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar7->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar7->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar7->predecessors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar7->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar7->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar7->successors).super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pBVar7->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pBVar7->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pBVar7->localVariables).
  super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar7->parent = pFVar12;
  (pBVar7->currentSourceLoc).super__Optional_base<spv::DebugSourceLocation,_true,_true>._M_payload.
  super__Optional_payload_base<spv::DebugSourceLocation>._M_engaged = false;
  (pBVar7->currentDebugScope).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  pBVar7->unreachable = false;
  local_68._M_head_impl = (Instruction *)operator_new(0x60);
  (local_68._M_head_impl)->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  (local_68._M_head_impl)->resultId = IVar10;
  (local_68._M_head_impl)->typeId = 0;
  (local_68._M_head_impl)->opCode = OpLabel;
  ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
  ((local_68._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  ((local_68._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->operands).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
  ((local_68._M_head_impl)->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
  (local_68._M_head_impl)->block = (Block *)0x0;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar7->instructions,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_68);
  if (local_68._M_head_impl != (Instruction *)0x0) {
    (*(local_68._M_head_impl)->_vptr_Instruction[1])();
  }
  ((pBVar7->instructions).
   super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
   ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
   super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
   super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
   super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl)->block = pBVar7;
  Module::mapInstruction
            (pFVar12->parent,
             (pBVar7->instructions).
             super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>._M_t.
             super__Tuple_impl<0UL,_spv::Instruction_*,_std::default_delete<spv::Instruction>_>.
             super__Head_base<0UL,_spv::Instruction_*,_false>._M_head_impl);
  this_00 = local_58;
  local_68._M_head_impl = (Instruction *)pBVar7;
  local_60 = (Function *)pBVar7;
  createSelectionMerge(local_58,pBVar7,local_50);
  pIVar6 = (Instruction *)operator_new(0x60);
  pvVar3 = local_48;
  pIVar6->_vptr_Instruction = (_func_int **)&PTR__Instruction_00afab78;
  pIVar6->resultId = 0;
  pIVar6->typeId = 0;
  pIVar6->opCode = OpSwitch;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar6->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar6->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar6->block = (Block *)0x0;
  __n = ((long)(local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish -
         (long)(local_48->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start >> 1) + 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&pIVar6->operands,__n);
  std::vector<bool,_std::allocator<bool>_>::reserve(&pIVar6->idOperand,__n);
  Instruction::addIdOperand(pIVar6,local_4c);
  p_Var8 = (_Head_base<0UL,_spv::Instruction_*,_false> *)
           ((segmentBlocks->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>)._M_impl
            .super__Vector_impl_data._M_start + (uint)defaultSegment);
  if (defaultSegment < 0) {
    p_Var8 = &local_68;
  }
  pBVar7 = *(Block **)p_Var8;
  Instruction::addIdOperand
            (pIVar6,*(Id *)((long)(((pBVar7->instructions).
                                    super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<spv::Instruction,_std::default_delete<spv::Instruction>_>
                                  ._M_t + 8));
  Block::addPredecessor(pBVar7,this_00->buildPoint);
  pvVar4 = local_40;
  piVar9 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (0 < (int)((ulong)((long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar9) >> 2)) {
    lVar11 = 0;
    do {
      Instruction::addImmediateOperand(pIVar6,piVar9[lVar11]);
      Instruction::addIdOperand
                (pIVar6,*(Id *)(**(long **)&((segmentBlocks->
                                             super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>
                                             )._M_impl.super__Vector_impl_data._M_start
                                             [(pvVar4->super__Vector_base<int,_std::allocator<int>_>
                                              )._M_impl.super__Vector_impl_data._M_start[lVar11]]->
                                            instructions).
                                            super__Vector_base<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
                                            ._M_impl.super__Vector_impl_data + 8));
      Block::addPredecessor
                ((segmentBlocks->super__Vector_base<spv::Block_*,_std::allocator<spv::Block_*>_>).
                 _M_impl.super__Vector_impl_data._M_start
                 [(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start[lVar11]],this_00->buildPoint);
      lVar11 = lVar11 + 1;
      piVar9 = (pvVar3->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (lVar11 < (int)((ulong)((long)(pvVar3->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_finish - (long)piVar9)
                           >> 2));
  }
  local_38._M_head_impl = pIVar6;
  addInstruction(this_00,(unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
                         &local_38);
  if (local_38._M_head_impl != (Instruction *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Instruction[1])();
  }
  ppBVar2 = (this_00->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppBVar2 ==
      (this_00->switchMerges).c.super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<spv::Block*,std::allocator<spv::Block*>>::_M_push_back_aux<spv::Block*const&>
              ((deque<spv::Block*,std::allocator<spv::Block*>> *)&this_00->switchMerges,
               (Block **)&local_68);
  }
  else {
    *ppBVar2 = (Block *)local_60;
    piVar1 = &(this_00->switchMerges).c.
              super__Deque_base<spv::Block_*,_std::allocator<spv::Block_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const std::vector<int>& caseValues,
                         const std::vector<int>& valueIndexToSegment, int defaultSegment,
                         std::vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->reserveOperands((caseValues.size() * 2) + 2);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}